

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FileOptions::Clear(FileOptions *this)

{
  byte bVar1;
  string *psVar2;
  long lVar3;
  
  internal::ExtensionSet::Clear(&this->_extensions_);
  bVar1 = (byte)this->_has_bits_[0];
  if (bVar1 != 0) {
    if (((bVar1 & 1) != 0) &&
       (psVar2 = this->java_package_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_[0] & 2) != 0) &&
       (psVar2 = this->java_outer_classname_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)
       ) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    this->java_multiple_files_ = false;
    this->java_generate_equals_and_hash_ = false;
    this->optimize_for_ = 1;
    if (((this->_has_bits_[0] & 0x20) != 0) &&
       (psVar2 = this->go_package_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    this->cc_generic_services_ = false;
    this->java_generic_services_ = false;
  }
  if (*(char *)((long)this->_has_bits_ + 1) != '\0') {
    this->py_generic_services_ = false;
  }
  if (0 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar3 = 0;
    do {
      (**(code **)(*(this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar3] + 0x20
                  ))();
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  this->_has_bits_[0] = 0;
  if ((this->_unknown_fields_).fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(&this->_unknown_fields_);
    return;
  }
  return;
}

Assistant:

void FileOptions::Clear() {
  _extensions_.Clear();
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_java_package()) {
      if (java_package_ != &::google::protobuf::internal::kEmptyString) {
        java_package_->clear();
      }
    }
    if (has_java_outer_classname()) {
      if (java_outer_classname_ != &::google::protobuf::internal::kEmptyString) {
        java_outer_classname_->clear();
      }
    }
    java_multiple_files_ = false;
    java_generate_equals_and_hash_ = false;
    optimize_for_ = 1;
    if (has_go_package()) {
      if (go_package_ != &::google::protobuf::internal::kEmptyString) {
        go_package_->clear();
      }
    }
    cc_generic_services_ = false;
    java_generic_services_ = false;
  }
  if (_has_bits_[8 / 32] & (0xffu << (8 % 32))) {
    py_generic_services_ = false;
  }
  uninterpreted_option_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}